

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O2

void proto3_arena_unittest::TestAllTypes::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  uint32_t uVar2;
  float fVar3;
  uint32_t uVar4;
  MessageLite *pMVar5;
  MessageLite *pMVar6;
  long lVar7;
  ulong uVar8;
  _func_int **pp_Var9;
  TestAllTypes *pTVar10;
  bool bVar11;
  char *failure_msg;
  void *pvVar12;
  TestAllTypes_NestedMessage *pTVar13;
  int iVar14;
  Arena *pAVar15;
  string *psVar16;
  Arena *arena;
  TestAllTypes *_this;
  TestAllTypes *local_50;
  allocator<char> local_41;
  string local_40;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_50 = (TestAllTypes *)to_msg;
  local_40._M_dataplus._M_p = (pointer)from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto3_arena_unittest::TestAllTypes_const*,proto3_arena_unittest::TestAllTypes*>
                          ((TestAllTypes **)&local_40,&local_50,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    iVar14 = 0xb3e;
LAB_00a71832:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_proto3_arena.pb.cc"
               ,iVar14,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_int32_,(RepeatedField<int> *)(from_msg + 2));
  google::protobuf::RepeatedField<long>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_int64_,
             (RepeatedField<long> *)&from_msg[3]._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_uint32_,
             (RepeatedField<unsigned_int> *)(from_msg + 5));
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_uint64_,
             (RepeatedField<unsigned_long> *)&from_msg[6]._internal_metadata_);
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_sint32_,(RepeatedField<int> *)(from_msg + 8));
  google::protobuf::RepeatedField<long>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_sint64_,
             (RepeatedField<long> *)&from_msg[9]._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_fixed32_,
             (RepeatedField<unsigned_int> *)(from_msg + 0xb));
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_fixed64_,
             (RepeatedField<unsigned_long> *)(from_msg + 0xc));
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_sfixed32_,(RepeatedField<int> *)(from_msg + 0xd));
  google::protobuf::RepeatedField<long>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_sfixed64_,(RepeatedField<long> *)(from_msg + 0xe))
  ;
  google::protobuf::RepeatedField<float>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_float_,(RepeatedField<float> *)(from_msg + 0xf));
  google::protobuf::RepeatedField<double>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_double_,(RepeatedField<double> *)(from_msg + 0x10)
            );
  google::protobuf::RepeatedField<bool>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_bool_,(RepeatedField<bool> *)(from_msg + 0x11));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_50->field_0)._impl_.repeated_string_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(from_msg + 0x12));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_50->field_0)._impl_.repeated_bytes_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&from_msg[0x13]._internal_metadata_);
  google::protobuf::RepeatedPtrField<proto3_arena_unittest::TestAllTypes_NestedMessage>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_nested_message_,
             (RepeatedPtrField<proto3_arena_unittest::TestAllTypes_NestedMessage> *)
             (from_msg + 0x15));
  google::protobuf::RepeatedPtrField<proto3_arena_unittest::ForeignMessage>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_foreign_message_,
             (RepeatedPtrField<proto3_arena_unittest::ForeignMessage> *)
             &from_msg[0x16]._internal_metadata_);
  google::protobuf::RepeatedPtrField<proto2_unittest_import::ImportMessage>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_import_message_,
             (RepeatedPtrField<proto2_unittest_import::ImportMessage> *)(from_msg + 0x18));
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_nested_enum_,
             (RepeatedField<int> *)&from_msg[0x19]._internal_metadata_);
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_foreign_enum_,
             (RepeatedField<int> *)(from_msg + 0x1b));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_50->field_0)._impl_.repeated_string_piece_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&from_msg[0x1c]._internal_metadata_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_50->field_0)._impl_.repeated_cord_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(from_msg + 0x1e));
  google::protobuf::RepeatedPtrField<proto3_arena_unittest::TestAllTypes_NestedMessage>::MergeFrom
            (&(local_50->field_0)._impl_.repeated_lazy_message_,
             (RepeatedPtrField<proto3_arena_unittest::TestAllTypes_NestedMessage> *)
             &from_msg[0x1f]._internal_metadata_);
  pTVar10 = local_50;
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      psVar16 = (string *)((ulong)from_msg[0x21]._vptr_MessageLite & 0xfffffffffffffffc);
      if (psVar16->_M_string_length == 0) {
        if (((ulong)(local_50->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ & 3) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,anon_var_dwarf_651463 + 5,&local_41);
          *(byte *)&pTVar10->field_0 = *(byte *)&pTVar10->field_0 | 1;
          pAVar15 = (Arena *)(pTVar10->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar15 & 1) != 0) {
            pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set<>
                    (&(pTVar10->field_0)._impl_.optional_string_,&local_40,pAVar15);
          std::__cxx11::string::~string((string *)&local_40);
        }
      }
      else {
        *(byte *)&local_50->field_0 = *(byte *)&local_50->field_0 | 1;
        pAVar15 = (Arena *)(local_50->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar15 & 1) != 0) {
          pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_50->field_0)._impl_.optional_string_,psVar16,pAVar15);
      }
    }
    pTVar10 = local_50;
    if ((uVar1 & 2) != 0) {
      psVar16 = (string *)(from_msg[0x21]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      if (psVar16->_M_string_length == 0) {
        if (((ulong)(local_50->field_0)._impl_.optional_bytes_.tagged_ptr_.ptr_ & 3) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,anon_var_dwarf_651463 + 5,&local_41);
          *(byte *)&pTVar10->field_0 = *(byte *)&pTVar10->field_0 | 2;
          pAVar15 = (Arena *)(pTVar10->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar15 & 1) != 0) {
            pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set<>
                    (&(pTVar10->field_0)._impl_.optional_bytes_,&local_40,pAVar15);
          std::__cxx11::string::~string((string *)&local_40);
        }
      }
      else {
        *(byte *)&local_50->field_0 = *(byte *)&local_50->field_0 | 2;
        pAVar15 = (Arena *)(local_50->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar15 & 1) != 0) {
          pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_50->field_0)._impl_.optional_bytes_,psVar16,pAVar15);
      }
    }
    pTVar10 = local_50;
    if ((uVar1 & 4) != 0) {
      psVar16 = (string *)((ulong)from_msg[0x22]._vptr_MessageLite & 0xfffffffffffffffc);
      if (psVar16->_M_string_length == 0) {
        if (((ulong)(local_50->field_0)._impl_.optional_string_piece_.tagged_ptr_.ptr_ & 3) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,anon_var_dwarf_651463 + 5,&local_41);
          *(byte *)&pTVar10->field_0 = *(byte *)&pTVar10->field_0 | 4;
          pAVar15 = (Arena *)(pTVar10->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar15 & 1) != 0) {
            pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set<>
                    (&(pTVar10->field_0)._impl_.optional_string_piece_,&local_40,pAVar15);
          std::__cxx11::string::~string((string *)&local_40);
        }
      }
      else {
        *(byte *)&local_50->field_0 = *(byte *)&local_50->field_0 | 4;
        pAVar15 = (Arena *)(local_50->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar15 & 1) != 0) {
          pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_50->field_0)._impl_.optional_string_piece_,psVar16,pAVar15);
      }
    }
    pTVar10 = local_50;
    if ((uVar1 & 8) != 0) {
      psVar16 = (string *)(from_msg[0x22]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      if (psVar16->_M_string_length == 0) {
        if (((ulong)(local_50->field_0)._impl_.optional_cord_.tagged_ptr_.ptr_ & 3) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,anon_var_dwarf_651463 + 5,&local_41);
          *(byte *)&pTVar10->field_0 = *(byte *)&pTVar10->field_0 | 8;
          pAVar15 = (Arena *)(pTVar10->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar15 & 1) != 0) {
            pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set<>
                    (&(pTVar10->field_0)._impl_.optional_cord_,&local_40,pAVar15);
          std::__cxx11::string::~string((string *)&local_40);
        }
      }
      else {
        *(byte *)&local_50->field_0 = *(byte *)&local_50->field_0 | 8;
        pAVar15 = (Arena *)(local_50->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar15 & 1) != 0) {
          pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_50->field_0)._impl_.optional_cord_,psVar16,pAVar15);
      }
    }
    if ((uVar1 & 0x10) != 0) {
      pMVar5 = (MessageLite *)from_msg[0x23]._vptr_MessageLite;
      if (pMVar5 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_nested_message_ != nullptr";
        iVar14 = 0xb84;
        goto LAB_00a71832;
      }
      pMVar6 = *(MessageLite **)((long)&local_50->field_0 + 0x220);
      if (pMVar6 == (MessageLite *)0x0) {
        pvVar12 = google::protobuf::Arena::
                  CopyConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>(arena,pMVar5);
        *(void **)((long)&local_50->field_0 + 0x220) = pvVar12;
      }
      else {
        proto3_arena_unittest::TestAllTypes_NestedMessage::MergeImpl(pMVar6,pMVar5);
      }
    }
    if ((uVar1 & 0x20) != 0) {
      pMVar5 = (MessageLite *)from_msg[0x23]._internal_metadata_.ptr_;
      if (pMVar5 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_foreign_message_ != nullptr";
        iVar14 = 0xb8c;
        goto LAB_00a71832;
      }
      pMVar6 = *(MessageLite **)((long)&local_50->field_0 + 0x228);
      if (pMVar6 == (MessageLite *)0x0) {
        pvVar12 = google::protobuf::Arena::CopyConstruct<proto3_arena_unittest::ForeignMessage>
                            (arena,pMVar5);
        *(void **)((long)&local_50->field_0 + 0x228) = pvVar12;
      }
      else {
        proto3_arena_unittest::ForeignMessage::MergeImpl(pMVar6,pMVar5);
      }
    }
    if ((uVar1 & 0x40) != 0) {
      pMVar5 = (MessageLite *)from_msg[0x24]._vptr_MessageLite;
      if (pMVar5 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_import_message_ != nullptr";
        iVar14 = 0xb94;
        goto LAB_00a71832;
      }
      pMVar6 = *(MessageLite **)((long)&local_50->field_0 + 0x230);
      if (pMVar6 == (MessageLite *)0x0) {
        pvVar12 = google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessage>
                            (arena,pMVar5);
        *(void **)((long)&local_50->field_0 + 0x230) = pvVar12;
      }
      else {
        proto2_unittest_import::ImportMessage::MergeImpl(pMVar6,pMVar5);
      }
    }
    if ((char)uVar1 < '\0') {
      pMVar5 = (MessageLite *)from_msg[0x24]._internal_metadata_.ptr_;
      if (pMVar5 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_public_import_message_ != nullptr";
        iVar14 = 0xb9c;
        goto LAB_00a71832;
      }
      pMVar6 = *(MessageLite **)((long)&local_50->field_0 + 0x238);
      if (pMVar6 == (MessageLite *)0x0) {
        pvVar12 = google::protobuf::Arena::
                  CopyConstruct<proto2_unittest_import::PublicImportMessage>(arena,pMVar5);
        *(void **)((long)&local_50->field_0 + 0x238) = pvVar12;
      }
      else {
        proto2_unittest_import::PublicImportMessage::MergeImpl(pMVar6,pMVar5);
      }
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      pMVar5 = (MessageLite *)from_msg[0x25]._vptr_MessageLite;
      if (pMVar5 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_lazy_message_ != nullptr";
        iVar14 = 0xba6;
        goto LAB_00a71832;
      }
      pMVar6 = *(MessageLite **)((long)&local_50->field_0 + 0x240);
      if (pMVar6 == (MessageLite *)0x0) {
        pvVar12 = google::protobuf::Arena::
                  CopyConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>(arena,pMVar5);
        *(void **)((long)&local_50->field_0 + 0x240) = pvVar12;
      }
      else {
        proto3_arena_unittest::TestAllTypes_NestedMessage::MergeImpl(pMVar6,pMVar5);
      }
    }
    if ((uVar1 >> 9 & 1) != 0) {
      pMVar5 = (MessageLite *)from_msg[0x25]._internal_metadata_.ptr_;
      if (pMVar5 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_unverified_lazy_message_ != nullptr";
        iVar14 = 0xbae;
        goto LAB_00a71832;
      }
      pMVar6 = *(MessageLite **)((long)&local_50->field_0 + 0x248);
      if (pMVar6 == (MessageLite *)0x0) {
        pvVar12 = google::protobuf::Arena::
                  CopyConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>(arena,pMVar5);
        *(void **)((long)&local_50->field_0 + 0x248) = pvVar12;
      }
      else {
        proto3_arena_unittest::TestAllTypes_NestedMessage::MergeImpl(pMVar6,pMVar5);
      }
    }
    if (((uVar1 >> 10 & 1) != 0) && (from_msg[0x26]._vptr_MessageLite != (_func_int **)0x0)) {
      *(_func_int ***)((long)&local_50->field_0 + 0x250) = from_msg[0x26]._vptr_MessageLite;
    }
    if (((uVar1 >> 0xb & 1) != 0) &&
       (iVar14 = (int)from_msg[0x26]._internal_metadata_.ptr_, iVar14 != 0)) {
      *(int *)((long)&local_50->field_0 + 600) = iVar14;
    }
    if (((uVar1 >> 0xc & 1) != 0) &&
       (uVar2 = *(uint32_t *)((long)&from_msg[0x26]._internal_metadata_.ptr_ + 4), uVar2 != 0)) {
      (local_50->field_0)._impl_.optional_uint32_ = uVar2;
    }
    if (((uVar1 >> 0xd & 1) != 0) && (from_msg[0x27]._vptr_MessageLite != (_func_int **)0x0)) {
      *(_func_int ***)((long)&local_50->field_0 + 0x260) = from_msg[0x27]._vptr_MessageLite;
    }
    if (((uVar1 >> 0xe & 1) != 0) && (lVar7 = from_msg[0x27]._internal_metadata_.ptr_, lVar7 != 0))
    {
      *(long *)((long)&local_50->field_0 + 0x268) = lVar7;
    }
    if (((short)uVar1 < 0) && (*(int *)&from_msg[0x28]._vptr_MessageLite != 0)) {
      *(int *)((long)&local_50->field_0 + 0x270) = *(int *)&from_msg[0x28]._vptr_MessageLite;
    }
  }
  if ((uVar1 & 0xff0000) != 0) {
    if (((uVar1 >> 0x10 & 1) != 0) &&
       (uVar2 = *(uint32_t *)((long)&from_msg[0x28]._vptr_MessageLite + 4), uVar2 != 0)) {
      (local_50->field_0)._impl_.optional_fixed32_ = uVar2;
    }
    if (((uVar1 >> 0x11 & 1) != 0) && (lVar7 = from_msg[0x28]._internal_metadata_.ptr_, lVar7 != 0))
    {
      *(long *)((long)&local_50->field_0 + 0x278) = lVar7;
    }
    if (((uVar1 >> 0x12 & 1) != 0) && (from_msg[0x29]._vptr_MessageLite != (_func_int **)0x0)) {
      *(_func_int ***)((long)&local_50->field_0 + 0x280) = from_msg[0x29]._vptr_MessageLite;
    }
    if (((uVar1 >> 0x13 & 1) != 0) &&
       (iVar14 = (int)from_msg[0x29]._internal_metadata_.ptr_, iVar14 != 0)) {
      *(int *)((long)&local_50->field_0 + 0x288) = iVar14;
    }
    if (((uVar1 >> 0x14 & 1) != 0) &&
       (fVar3 = *(float *)((long)&from_msg[0x29]._internal_metadata_.ptr_ + 4), fVar3 != 0.0)) {
      (local_50->field_0)._impl_.optional_float_ = fVar3;
    }
    if (((uVar1 >> 0x15 & 1) != 0) && (from_msg[0x2a]._vptr_MessageLite != (_func_int **)0x0)) {
      *(_func_int ***)((long)&local_50->field_0 + 0x290) = from_msg[0x2a]._vptr_MessageLite;
    }
    if (((uVar1 >> 0x16 & 1) != 0) && ((char)from_msg[0x2a]._internal_metadata_.ptr_ == '\x01')) {
      *(undefined1 *)((long)&local_50->field_0 + 0x298) = 1;
    }
    if (((uVar1 >> 0x17 & 1) != 0) &&
       (iVar14 = *(int *)((long)&from_msg[0x2a]._internal_metadata_.ptr_ + 4), iVar14 != 0)) {
      (local_50->field_0)._impl_.optional_nested_enum_ = iVar14;
    }
  }
  if (0xffffff < uVar1) {
    if (((uVar1 >> 0x18 & 1) != 0) && (*(int *)&from_msg[0x2b]._vptr_MessageLite != 0)) {
      *(int *)((long)&local_50->field_0 + 0x2a0) = *(int *)&from_msg[0x2b]._vptr_MessageLite;
    }
    if ((uVar1 >> 0x19 & 1) != 0) {
      (local_50->field_0)._impl_.proto3_optional_float_ =
           *(float *)((long)&from_msg[0x2b]._vptr_MessageLite + 4);
    }
    if ((uVar1 >> 0x1a & 1) != 0) {
      bVar11 = absl::lts_20250127::Cord::empty((Cord *)&from_msg[0x2b]._internal_metadata_);
      if (!bVar11) {
        _internal_set_optional_bytes_cord(local_50,(Cord *)&from_msg[0x2b]._internal_metadata_);
      }
    }
    if ((uVar1 >> 0x1b & 1) != 0) {
      uVar8 = from_msg[0x2c]._internal_metadata_.ptr_;
      (local_50->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_50->field_0)._impl_._has_bits_.has_bits_[0] | 0x8000000;
      pAVar15 = (Arena *)(local_50->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar15 & 1) != 0) {
        pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_50->field_0)._impl_.proto3_optional_string_,
                 (string *)(uVar8 & 0xfffffffffffffffc),pAVar15);
    }
    if ((uVar1 >> 0x1c & 1) != 0) {
      pp_Var9 = from_msg[0x2d]._vptr_MessageLite;
      (local_50->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_50->field_0)._impl_._has_bits_.has_bits_[0] | 0x10000000;
      pAVar15 = (Arena *)(local_50->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar15 & 1) != 0) {
        pAVar15 = *(Arena **)((ulong)pAVar15 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_50->field_0)._impl_.proto3_optional_bytes_,
                 (string *)((ulong)pp_Var9 & 0xfffffffffffffffc),pAVar15);
    }
    if ((uVar1 >> 0x1d & 1) != 0) {
      pMVar5 = (MessageLite *)from_msg[0x2d]._internal_metadata_.ptr_;
      if (pMVar5 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_lazy_import_message_ != nullptr";
        iVar14 = 0xc13;
        goto LAB_00a71832;
      }
      pMVar6 = *(MessageLite **)((long)&local_50->field_0 + 0x2c8);
      if (pMVar6 == (MessageLite *)0x0) {
        pvVar12 = google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessage>
                            (arena,pMVar5);
        *(void **)((long)&local_50->field_0 + 0x2c8) = pvVar12;
      }
      else {
        proto2_unittest_import::ImportMessage::MergeImpl(pMVar6,pMVar5);
      }
    }
    if ((uVar1 >> 0x1e & 1) != 0) {
      *(_func_int ***)((long)&local_50->field_0 + 0x2d0) = from_msg[0x2e]._vptr_MessageLite;
    }
    if ((int)uVar1 < 0) {
      *(int *)((long)&local_50->field_0 + 0x2d8) = (int)from_msg[0x2e]._internal_metadata_.ptr_;
    }
  }
  uVar1 = *(uint *)((long)&from_msg[1]._vptr_MessageLite + 4);
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      (local_50->field_0)._impl_.proto3_optional_uint32_ =
           *(uint32_t *)((long)&from_msg[0x2e]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 & 2) != 0) {
      (local_50->field_0)._impl_.proto3_optional_uint64_ =
           (uint64_t)from_msg[0x2f]._vptr_MessageLite;
    }
    if ((uVar1 & 4) != 0) {
      (local_50->field_0)._impl_.proto3_optional_sint64_ = from_msg[0x2f]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 8) != 0) {
      (local_50->field_0)._impl_.proto3_optional_sint32_ =
           *(int32_t *)&from_msg[0x30]._vptr_MessageLite;
    }
    if ((uVar1 & 0x10) != 0) {
      (local_50->field_0)._impl_.proto3_optional_fixed32_ =
           *(uint32_t *)((long)&from_msg[0x30]._vptr_MessageLite + 4);
    }
    if ((uVar1 & 0x20) != 0) {
      (local_50->field_0)._impl_.proto3_optional_fixed64_ = from_msg[0x30]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 0x40) != 0) {
      (local_50->field_0)._impl_.proto3_optional_sfixed64_ =
           (int64_t)from_msg[0x31]._vptr_MessageLite;
    }
    if ((char)uVar1 < '\0') {
      (local_50->field_0)._impl_.proto3_optional_sfixed32_ =
           (int32_t)from_msg[0x31]._internal_metadata_.ptr_;
    }
  }
  if ((uVar1 & 0x300) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      (local_50->field_0)._impl_.proto3_optional_bool_ =
           *(bool *)((long)&from_msg[0x31]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 >> 9 & 1) != 0) {
      (local_50->field_0)._impl_.proto3_optional_double_ = (double)from_msg[0x32]._vptr_MessageLite;
    }
  }
  *(ulong *)(local_50->field_0)._impl_._has_bits_.has_bits_ =
       *(ulong *)(local_50->field_0)._impl_._has_bits_.has_bits_ |
       (ulong)from_msg[1]._vptr_MessageLite;
  uVar2 = *(uint32_t *)&from_msg[0x33]._vptr_MessageLite;
  if (uVar2 == 0) goto switchD_00a71673_default;
  uVar4 = (local_50->field_0)._impl_._oneof_case_[0];
  if (uVar4 != uVar2) {
    if (uVar4 != 0) {
      clear_oneof_field(local_50);
    }
    (local_50->field_0)._impl_._oneof_case_[0] = uVar2;
  }
  switch(uVar2) {
  case 0x6f:
    *(int *)((long)&local_50->field_0 + 0x318) = (int)from_msg[0x32]._internal_metadata_.ptr_;
    break;
  case 0x70:
    if (uVar4 == uVar2) {
      proto3_arena_unittest::TestAllTypes_NestedMessage::MergeImpl
                ((MessageLite *)(local_50->field_0)._impl_.oneof_field_.oneof_nested_message_,
                 (MessageLite *)from_msg[0x32]._internal_metadata_.ptr_);
    }
    else {
      pTVar13 = (TestAllTypes_NestedMessage *)
                google::protobuf::Arena::
                CopyConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>
                          (arena,(void *)from_msg[0x32]._internal_metadata_.ptr_);
      (local_50->field_0)._impl_.oneof_field_.oneof_nested_message_ = pTVar13;
    }
    break;
  case 0x71:
    if (uVar4 != uVar2) {
      (local_50->field_0)._impl_.oneof_field_.oneof_nested_message_ =
           (TestAllTypes_NestedMessage *)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0x33]._vptr_MessageLite == 0x71) goto LAB_00a716d2;
LAB_00a716a6:
    psVar16 = (string *)&google::protobuf::internal::fixed_address_empty_string;
    goto LAB_00a716dd;
  case 0x72:
    if (uVar4 != uVar2) {
      (local_50->field_0)._impl_.oneof_field_.oneof_nested_message_ =
           (TestAllTypes_NestedMessage *)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0x33]._vptr_MessageLite != 0x72) goto LAB_00a716a6;
LAB_00a716d2:
    psVar16 = (string *)(from_msg[0x32]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
LAB_00a716dd:
    google::protobuf::internal::ArenaStringPtr::Set<>
              (&(local_50->field_0)._impl_.oneof_field_.oneof_string_,psVar16,arena);
  }
switchD_00a71673_default:
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_50->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void TestAllTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestAllTypes*>(&to_msg);
  auto& from = static_cast<const TestAllTypes&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_arena_unittest.TestAllTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_repeated_int64()->MergeFrom(from._internal_repeated_int64());
  _this->_internal_mutable_repeated_uint32()->MergeFrom(from._internal_repeated_uint32());
  _this->_internal_mutable_repeated_uint64()->MergeFrom(from._internal_repeated_uint64());
  _this->_internal_mutable_repeated_sint32()->MergeFrom(from._internal_repeated_sint32());
  _this->_internal_mutable_repeated_sint64()->MergeFrom(from._internal_repeated_sint64());
  _this->_internal_mutable_repeated_fixed32()->MergeFrom(from._internal_repeated_fixed32());
  _this->_internal_mutable_repeated_fixed64()->MergeFrom(from._internal_repeated_fixed64());
  _this->_internal_mutable_repeated_sfixed32()->MergeFrom(from._internal_repeated_sfixed32());
  _this->_internal_mutable_repeated_sfixed64()->MergeFrom(from._internal_repeated_sfixed64());
  _this->_internal_mutable_repeated_float()->MergeFrom(from._internal_repeated_float());
  _this->_internal_mutable_repeated_double()->MergeFrom(from._internal_repeated_double());
  _this->_internal_mutable_repeated_bool()->MergeFrom(from._internal_repeated_bool());
  _this->_internal_mutable_repeated_string()->MergeFrom(from._internal_repeated_string());
  _this->_internal_mutable_repeated_bytes()->MergeFrom(from._internal_repeated_bytes());
  _this->_internal_mutable_repeated_nested_message()->MergeFrom(
      from._internal_repeated_nested_message());
  _this->_internal_mutable_repeated_foreign_message()->MergeFrom(
      from._internal_repeated_foreign_message());
  _this->_internal_mutable_repeated_import_message()->MergeFrom(
      from._internal_repeated_import_message());
  _this->_internal_mutable_repeated_nested_enum()->MergeFrom(from._internal_repeated_nested_enum());
  _this->_internal_mutable_repeated_foreign_enum()->MergeFrom(from._internal_repeated_foreign_enum());
  _this->_internal_mutable_repeated_string_piece()->MergeFrom(from._internal_repeated_string_piece());
  _this->_internal_mutable_repeated_cord()->MergeFrom(from._internal_repeated_cord());
  _this->_internal_mutable_repeated_lazy_message()->MergeFrom(
      from._internal_repeated_lazy_message());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!from._internal_optional_string().empty()) {
        _this->_internal_set_optional_string(from._internal_optional_string());
      } else {
        if (_this->_impl_.optional_string_.IsDefault()) {
          _this->_internal_set_optional_string("");
        }
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!from._internal_optional_bytes().empty()) {
        _this->_internal_set_optional_bytes(from._internal_optional_bytes());
      } else {
        if (_this->_impl_.optional_bytes_.IsDefault()) {
          _this->_internal_set_optional_bytes("");
        }
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (!from._internal_optional_string_piece().empty()) {
        _this->_internal_set_optional_string_piece(from._internal_optional_string_piece());
      } else {
        if (_this->_impl_.optional_string_piece_.IsDefault()) {
          _this->_internal_set_optional_string_piece("");
        }
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (!from._internal_optional_cord().empty()) {
        _this->_internal_set_optional_cord(from._internal_optional_cord());
      } else {
        if (_this->_impl_.optional_cord_.IsDefault()) {
          _this->_internal_set_optional_cord("");
        }
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.optional_foreign_message_ != nullptr);
      if (_this->_impl_.optional_foreign_message_ == nullptr) {
        _this->_impl_.optional_foreign_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_foreign_message_);
      } else {
        _this->_impl_.optional_foreign_message_->MergeFrom(*from._impl_.optional_foreign_message_);
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      ABSL_DCHECK(from._impl_.optional_import_message_ != nullptr);
      if (_this->_impl_.optional_import_message_ == nullptr) {
        _this->_impl_.optional_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_import_message_);
      } else {
        _this->_impl_.optional_import_message_->MergeFrom(*from._impl_.optional_import_message_);
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      ABSL_DCHECK(from._impl_.optional_public_import_message_ != nullptr);
      if (_this->_impl_.optional_public_import_message_ == nullptr) {
        _this->_impl_.optional_public_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_public_import_message_);
      } else {
        _this->_impl_.optional_public_import_message_->MergeFrom(*from._impl_.optional_public_import_message_);
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      ABSL_DCHECK(from._impl_.optional_lazy_message_ != nullptr);
      if (_this->_impl_.optional_lazy_message_ == nullptr) {
        _this->_impl_.optional_lazy_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_lazy_message_);
      } else {
        _this->_impl_.optional_lazy_message_->MergeFrom(*from._impl_.optional_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(from._impl_.optional_unverified_lazy_message_ != nullptr);
      if (_this->_impl_.optional_unverified_lazy_message_ == nullptr) {
        _this->_impl_.optional_unverified_lazy_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_unverified_lazy_message_);
      } else {
        _this->_impl_.optional_unverified_lazy_message_->MergeFrom(*from._impl_.optional_unverified_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (from._internal_optional_int64() != 0) {
        _this->_impl_.optional_int64_ = from._impl_.optional_int64_;
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (from._internal_optional_int32() != 0) {
        _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
      }
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (from._internal_optional_uint32() != 0) {
        _this->_impl_.optional_uint32_ = from._impl_.optional_uint32_;
      }
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (from._internal_optional_uint64() != 0) {
        _this->_impl_.optional_uint64_ = from._impl_.optional_uint64_;
      }
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (from._internal_optional_sint64() != 0) {
        _this->_impl_.optional_sint64_ = from._impl_.optional_sint64_;
      }
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (from._internal_optional_sint32() != 0) {
        _this->_impl_.optional_sint32_ = from._impl_.optional_sint32_;
      }
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (from._internal_optional_fixed32() != 0) {
        _this->_impl_.optional_fixed32_ = from._impl_.optional_fixed32_;
      }
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (from._internal_optional_fixed64() != 0) {
        _this->_impl_.optional_fixed64_ = from._impl_.optional_fixed64_;
      }
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (from._internal_optional_sfixed64() != 0) {
        _this->_impl_.optional_sfixed64_ = from._impl_.optional_sfixed64_;
      }
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (from._internal_optional_sfixed32() != 0) {
        _this->_impl_.optional_sfixed32_ = from._impl_.optional_sfixed32_;
      }
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (::absl::bit_cast<::uint32_t>(from._internal_optional_float()) != 0) {
        _this->_impl_.optional_float_ = from._impl_.optional_float_;
      }
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (::absl::bit_cast<::uint64_t>(from._internal_optional_double()) != 0) {
        _this->_impl_.optional_double_ = from._impl_.optional_double_;
      }
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (from._internal_optional_bool() != 0) {
        _this->_impl_.optional_bool_ = from._impl_.optional_bool_;
      }
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      if (from._internal_optional_nested_enum() != 0) {
        _this->_impl_.optional_nested_enum_ = from._impl_.optional_nested_enum_;
      }
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      if (from._internal_optional_foreign_enum() != 0) {
        _this->_impl_.optional_foreign_enum_ = from._impl_.optional_foreign_enum_;
      }
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      _this->_impl_.proto3_optional_float_ = from._impl_.proto3_optional_float_;
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      if (!from._internal_optional_bytes_cord().empty()) {
        _this->_internal_set_optional_bytes_cord(from._internal_optional_bytes_cord());
      }
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      _this->_internal_set_proto3_optional_string(from._internal_proto3_optional_string());
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      _this->_internal_set_proto3_optional_bytes(from._internal_proto3_optional_bytes());
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      ABSL_DCHECK(from._impl_.optional_lazy_import_message_ != nullptr);
      if (_this->_impl_.optional_lazy_import_message_ == nullptr) {
        _this->_impl_.optional_lazy_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_lazy_import_message_);
      } else {
        _this->_impl_.optional_lazy_import_message_->MergeFrom(*from._impl_.optional_lazy_import_message_);
      }
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      _this->_impl_.proto3_optional_int64_ = from._impl_.proto3_optional_int64_;
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      _this->_impl_.proto3_optional_int32_ = from._impl_.proto3_optional_int32_;
    }
  }
  cached_has_bits = from._impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.proto3_optional_uint32_ = from._impl_.proto3_optional_uint32_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.proto3_optional_uint64_ = from._impl_.proto3_optional_uint64_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.proto3_optional_sint64_ = from._impl_.proto3_optional_sint64_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.proto3_optional_sint32_ = from._impl_.proto3_optional_sint32_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.proto3_optional_fixed32_ = from._impl_.proto3_optional_fixed32_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.proto3_optional_fixed64_ = from._impl_.proto3_optional_fixed64_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.proto3_optional_sfixed64_ = from._impl_.proto3_optional_sfixed64_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.proto3_optional_sfixed32_ = from._impl_.proto3_optional_sfixed32_;
    }
  }
  if ((cached_has_bits & 0x00000300u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.proto3_optional_bool_ = from._impl_.proto3_optional_bool_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.proto3_optional_double_ = from._impl_.proto3_optional_double_;
    }
  }
  _this->_impl_._has_bits_.Or(from._impl_._has_bits_);
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofUint32: {
        _this->_impl_.oneof_field_.oneof_uint32_ = from._impl_.oneof_field_.oneof_uint32_;
        break;
      }
      case kOneofNestedMessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_nested_message_);
        } else {
          _this->_impl_.oneof_field_.oneof_nested_message_->MergeFrom(*from._impl_.oneof_field_.oneof_nested_message_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}